

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O0

int leave_block_callback(MD_BLOCKTYPE type,void *detail,void *userdata)

{
  MD_CHAR *in_RDX;
  int *in_RSI;
  undefined4 in_EDI;
  MD_HTML *r;
  MD_CHAR *in_stack_ffffffffffffffc8;
  MD_HTML *in_stack_ffffffffffffffd0;
  MD_HTML *r_00;
  
  switch(in_EDI) {
  case 0:
    break;
  case 1:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 2:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 3:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 4:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 5:
    break;
  case 6:
    r_00 = (MD_HTML *)leave_block_callback::head[*in_RSI - 1];
    strlen(leave_block_callback::head[*in_RSI - 1]);
    render_verbatim(r_00,in_RDX,0);
    break;
  case 7:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 8:
    break;
  case 9:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 10:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 0xb:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 0xc:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 0xd:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 0xe:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
    break;
  case 0xf:
    render_verbatim(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0);
  }
  return 0;
}

Assistant:

static int
leave_block_callback(MD_BLOCKTYPE type, void* detail, void* userdata)
{
    static const MD_CHAR* head[6] = { "</h1>\n", "</h2>\n", "</h3>\n", "</h4>\n", "</h5>\n", "</h6>\n" };
    MD_HTML* r = (MD_HTML*) userdata;

    switch(type) {
        case MD_BLOCK_DOC:      /*noop*/ break;
        case MD_BLOCK_QUOTE:    RENDER_VERBATIM(r, "</blockquote>\n"); break;
        case MD_BLOCK_UL:       RENDER_VERBATIM(r, "</ul>\n"); break;
        case MD_BLOCK_OL:       RENDER_VERBATIM(r, "</ol>\n"); break;
        case MD_BLOCK_LI:       RENDER_VERBATIM(r, "</li>\n"); break;
        case MD_BLOCK_HR:       /*noop*/ break;
        case MD_BLOCK_H:        RENDER_VERBATIM(r, head[((MD_BLOCK_H_DETAIL*)detail)->level - 1]); break;
        case MD_BLOCK_CODE:     RENDER_VERBATIM(r, "</code></pre>\n"); break;
        case MD_BLOCK_HTML:     /* noop */ break;
        case MD_BLOCK_P:        RENDER_VERBATIM(r, "</p>\n"); break;
        case MD_BLOCK_TABLE:    RENDER_VERBATIM(r, "</table>\n"); break;
        case MD_BLOCK_THEAD:    RENDER_VERBATIM(r, "</thead>\n"); break;
        case MD_BLOCK_TBODY:    RENDER_VERBATIM(r, "</tbody>\n"); break;
        case MD_BLOCK_TR:       RENDER_VERBATIM(r, "</tr>\n"); break;
        case MD_BLOCK_TH:       RENDER_VERBATIM(r, "</th>\n"); break;
        case MD_BLOCK_TD:       RENDER_VERBATIM(r, "</td>\n"); break;
    }

    return 0;
}